

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O0

void __thiscall
TPZPrInteg<TPZIntPrism3D>::SetOrder(TPZPrInteg<TPZIntPrism3D> *this,TPZVec<int> *ord,int type)

{
  int64_t iVar1;
  int *piVar2;
  TPZGaussRule *pTVar3;
  TPZVec<int> *in_RSI;
  long in_RDI;
  int in_stack_00000028;
  int in_stack_0000002c;
  TPZIntRuleList *in_stack_00000030;
  int in_stack_000000a4;
  TPZVec<int> *in_stack_000000a8;
  TPZIntPrism3D *in_stack_000000b0;
  
  iVar1 = TPZVec<int>::NElements(in_RSI);
  if (iVar1 < 4) {
    std::operator<<((ostream *)&std::cout,
                    "TPZPrInteg::SetOrder: number of integration points specified smaller than dimension\n"
                   );
  }
  else {
    TPZIntPrism3D::SetOrder(in_stack_000000b0,in_stack_000000a8,in_stack_000000a4);
    piVar2 = TPZVec<int>::operator[](in_RSI,3);
    *(int *)(in_RDI + 0x40) = *piVar2;
    TPZVec<int>::operator[](in_RSI,3);
    pTVar3 = TPZIntRuleList::GetRule(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
    *(TPZGaussRule **)(in_RDI + 0x48) = pTVar3;
  }
  return;
}

Assistant:

void SetOrder(TPZVec<int> &ord, int type = 0) override
    {
#ifndef PZNODEBUG
		if(ord.NElements() < Dim) {
			std::cout << "TPZPrInteg::SetOrder: number of integration points specified smaller than dimension\n";
			return;
		}
#endif
		TFather::SetOrder(ord,type);
		fOrdKsi = ord[Dim-1];
		fIntP   = TPZIntRuleList::gIntRuleList.GetRule(ord[Dim-1]);
    }